

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

void __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::unwind_rparen(jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *this,vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                      *output_stack,error_code *ec)

{
  pointer ptVar1;
  bool bVar2;
  pointer ptVar3;
  const_iterator cVar4;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_60;
  const_iterator __first;
  
  cVar4._M_current =
       (this->operator_stack_).
       super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    __first._M_current = cVar4._M_current + -1;
    ptVar1 = (this->operator_stack_).
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar3 = cVar4._M_current;
    if ((cVar4._M_current == ptVar1) || (ptVar3 = ptVar1, (__first._M_current)->type_ == lparen))
    break;
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)output_stack,__first._M_current);
    cVar4._M_current = __first._M_current;
  }
  if (cVar4._M_current == ptVar3) {
    std::error_code::operator=(ec,unbalanced_parentheses);
    return;
  }
  std::
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ::erase(&this->operator_stack_,__first,
          (this->operator_stack_).
          super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  bVar2 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ::is_projection((output_stack->
                          super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish + -1);
  if (bVar2) {
    local_60.key_._M_dataplus._M_p = (pointer)&local_60.key_.field_2;
    local_60.type_ = pipe;
    local_60.key_._M_string_length = 0;
    local_60.key_.field_2._M_local_buf[0] = '\0';
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)output_stack,&local_60);
    token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
    ~token(&local_60);
  }
  return;
}

Assistant:

void unwind_rparen(std::vector<token<Json>>& output_stack, std::error_code& ec)
        {
            auto it = operator_stack_.rbegin();
            while (it != operator_stack_.rend() && !(*it).is_lparen())
            {
                output_stack.push_back(std::move(*it));
                ++it;
            }
            if (it == operator_stack_.rend())
            {
                ec = jmespath_errc::unbalanced_parentheses;
                return;
            }
            ++it;
            operator_stack_.erase(it.base(),operator_stack_.end());
            if (output_stack.back().is_projection())
            {
                output_stack.push_back(token<Json>(pipe_arg));
            }
        }